

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void getEnv(char *name,uint nameLength,char **value,uint *valueLength)

{
  char *__s;
  size_t sVar1;
  uint systemValueLength;
  char *systemValue;
  uint *valueLength_local;
  char **value_local;
  uint nameLength_local;
  char *name_local;
  
  if ((name == (char *)0x0) || (value == (char **)0x0)) {
    if (valueLength != (uint *)0x0) {
      *valueLength = 0;
    }
  }
  else {
    __s = getenv(name);
    if (__s == (char *)0x0) {
      invalidateStringOutParameter(value,valueLength);
    }
    else {
      sVar1 = strlen(__s);
      if ((uint)sVar1 == 0) {
        invalidateStringOutParameter(value,valueLength);
      }
      else {
        copyToStringOutParameter(__s,(uint)sVar1,value,valueLength);
      }
    }
  }
  return;
}

Assistant:

void getEnv(const char * name, unsigned int nameLength, char ** value, unsigned int * valueLength)
{
    (void)nameLength;

    if (name == 0x0 || value == 0x0)
    {
        if (valueLength != 0x0)
        {
            *valueLength = 0;
        }

        return;
    }

    const char * systemValue = getenv(name);

    if (systemValue == 0x0)
    {
        invalidateStringOutParameter(value, valueLength);
        return;
    }

    unsigned int systemValueLength = (unsigned int)strlen(systemValue);

    if (systemValueLength == 0)
    {
        invalidateStringOutParameter(value, valueLength);
        return;
    }

    copyToStringOutParameter(systemValue, systemValueLength, value, valueLength);
}